

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O0

void __thiscall
btBridgedManifoldResult::addContactPoint
          (btBridgedManifoldResult *this,btVector3 *normalOnBInWorld,btVector3 *pointInWorld,
          btScalar depth)

{
  long *plVar1;
  btCollisionObject *pbVar2;
  btCollisionObject *pbVar3;
  btManifoldPoint *in_RDI;
  btVector3 bVar4;
  btCollisionObjectWrapper *obj1Wrap;
  btCollisionObjectWrapper *obj0Wrap;
  btManifoldPoint newPt;
  btVector3 localB;
  btVector3 localA;
  btVector3 pointA;
  bool isSwapped;
  btScalar in_stack_fffffffffffffe54;
  btVector3 *in_stack_fffffffffffffe58;
  btVector3 *in_stack_fffffffffffffe60;
  undefined8 uVar5;
  btVector3 *in_stack_fffffffffffffe68;
  undefined8 uVar6;
  btVector3 *in_stack_fffffffffffffe98;
  btTransform *in_stack_fffffffffffffea0;
  btScalar local_108;
  btScalar local_104;
  btScalar local_100;
  btScalar local_fc;
  btVector3 local_68;
  btVector3 local_58;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  byte local_1d;
  
  pbVar2 = btPersistentManifold::getBody0
                     (*(btPersistentManifold **)((in_RDI->m_localPointA).m_floats + 2));
  pbVar3 = btCollisionObjectWrapper::getCollisionObject
                     (*(btCollisionObjectWrapper **)(in_RDI->m_localPointB).m_floats);
  local_1d = pbVar2 != pbVar3;
  bVar4 = ::operator*(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58->m_floats);
  local_38 = bVar4.m_floats._8_8_;
  local_40 = bVar4.m_floats._0_8_;
  bVar4 = operator+(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  local_28 = bVar4.m_floats._8_8_;
  local_30 = bVar4.m_floats._0_8_;
  btVector3::btVector3(&local_58);
  btVector3::btVector3(&local_68);
  if ((local_1d & 1) == 0) {
    pbVar2 = btCollisionObjectWrapper::getCollisionObject
                       (*(btCollisionObjectWrapper **)(in_RDI->m_localPointB).m_floats);
    btCollisionObject::getWorldTransform(pbVar2);
    bVar4 = btTransform::invXform(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    local_58.m_floats._8_8_ = bVar4.m_floats._8_8_;
    local_58.m_floats._0_8_ = bVar4.m_floats._0_8_;
    pbVar2 = btCollisionObjectWrapper::getCollisionObject
                       (*(btCollisionObjectWrapper **)((in_RDI->m_localPointB).m_floats + 2));
    btCollisionObject::getWorldTransform(pbVar2);
    bVar4 = btTransform::invXform(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    local_68.m_floats._8_8_ = bVar4.m_floats._8_8_;
    local_68.m_floats._0_8_ = bVar4.m_floats._0_8_;
  }
  else {
    pbVar2 = btCollisionObjectWrapper::getCollisionObject
                       (*(btCollisionObjectWrapper **)((in_RDI->m_localPointB).m_floats + 2));
    btCollisionObject::getWorldTransform(pbVar2);
    bVar4 = btTransform::invXform(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    local_58.m_floats._8_8_ = bVar4.m_floats._8_8_;
    local_58.m_floats._0_8_ = bVar4.m_floats._0_8_;
    pbVar2 = btCollisionObjectWrapper::getCollisionObject
                       (*(btCollisionObjectWrapper **)(in_RDI->m_localPointB).m_floats);
    btCollisionObject::getWorldTransform(pbVar2);
    bVar4 = btTransform::invXform(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    local_68.m_floats._8_8_ = bVar4.m_floats._8_8_;
    local_68.m_floats._0_8_ = bVar4.m_floats._0_8_;
  }
  btManifoldPoint::btManifoldPoint
            (in_RDI,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
             in_stack_fffffffffffffe54);
  if ((local_1d & 1) == 0) {
    local_108 = (in_RDI->m_positionWorldOnB).m_floats[0];
    local_104 = (in_RDI->m_positionWorldOnB).m_floats[1];
    local_100 = (in_RDI->m_positionWorldOnB).m_floats[2];
    local_fc = (in_RDI->m_positionWorldOnB).m_floats[3];
  }
  else {
    local_108 = (in_RDI->m_positionWorldOnB).m_floats[1];
    local_104 = (in_RDI->m_positionWorldOnB).m_floats[0];
    local_100 = (in_RDI->m_positionWorldOnB).m_floats[3];
    local_fc = (in_RDI->m_positionWorldOnB).m_floats[2];
  }
  if ((local_1d & 1) == 0) {
    uVar6 = *(undefined8 *)(in_RDI->m_localPointB).m_floats;
  }
  else {
    uVar6 = *(undefined8 *)((in_RDI->m_localPointB).m_floats + 2);
  }
  if ((local_1d & 1) == 0) {
    uVar5 = *(undefined8 *)((in_RDI->m_localPointB).m_floats + 2);
  }
  else {
    uVar5 = *(undefined8 *)(in_RDI->m_localPointB).m_floats;
  }
  plVar1 = *(long **)(in_RDI->m_positionWorldOnA).m_floats;
  (**(code **)(*plVar1 + 0x18))
            (plVar1,&stack0xfffffffffffffe98,uVar6,local_108,local_100,uVar5,local_104,local_fc);
  return;
}

Assistant:

virtual void addContactPoint(const btVector3& normalOnBInWorld,const btVector3& pointInWorld,btScalar depth)
	{
		bool isSwapped = m_manifoldPtr->getBody0() != m_body0Wrap->getCollisionObject();
		btVector3 pointA = pointInWorld + normalOnBInWorld * depth;
		btVector3 localA;
		btVector3 localB;
		if (isSwapped)
		{
			localA = m_body1Wrap->getCollisionObject()->getWorldTransform().invXform(pointA );
			localB = m_body0Wrap->getCollisionObject()->getWorldTransform().invXform(pointInWorld);
		} else
		{
			localA = m_body0Wrap->getCollisionObject()->getWorldTransform().invXform(pointA );
			localB = m_body1Wrap->getCollisionObject()->getWorldTransform().invXform(pointInWorld);
		}
		
		btManifoldPoint newPt(localA,localB,normalOnBInWorld,depth);
		newPt.m_positionWorldOnA = pointA;
		newPt.m_positionWorldOnB = pointInWorld;
		
	   //BP mod, store contact triangles.
		if (isSwapped)
		{
			newPt.m_partId0 = m_partId1;
			newPt.m_partId1 = m_partId0;
			newPt.m_index0  = m_index1;
			newPt.m_index1  = m_index0;
		} else
		{
			newPt.m_partId0 = m_partId0;
			newPt.m_partId1 = m_partId1;
			newPt.m_index0  = m_index0;
			newPt.m_index1  = m_index1;
		}

		//experimental feature info, for per-triangle material etc.
		const btCollisionObjectWrapper* obj0Wrap = isSwapped? m_body1Wrap : m_body0Wrap;
		const btCollisionObjectWrapper* obj1Wrap = isSwapped? m_body0Wrap : m_body1Wrap;
		m_resultCallback.addSingleResult(newPt,obj0Wrap,newPt.m_partId0,newPt.m_index0,obj1Wrap,newPt.m_partId1,newPt.m_index1);

	}